

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphbuilderadapter.cpp
# Opt level: O2

void __thiscall
YAML::GraphBuilderAdapter::OnSequenceStart
          (GraphBuilderAdapter *this,Mark *mark,string *tag,anchor_t anchor,value param_4)

{
  GraphBuilderInterface *pGVar1;
  void *pvVar2;
  ContainerFrame local_38;
  
  pGVar1 = this->m_builder;
  pvVar2 = GetCurrentParent(this);
  pvVar2 = (void *)(**(code **)(*(long *)pGVar1 + 0x20))(pGVar1,mark,tag,pvVar2);
  local_38.pPrevKeyNode = &ContainerFrame::sequenceMarker;
  local_38.pContainer = pvVar2;
  std::
  deque<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>
  ::emplace_back<YAML::GraphBuilderAdapter::ContainerFrame>(&(this->m_containers).c,&local_38);
  RegisterAnchor(this,anchor,pvVar2);
  return;
}

Assistant:

void GraphBuilderAdapter::OnSequenceStart(const Mark &mark,
                                          const std::string &tag,
                                          anchor_t anchor,
                                          EmitterStyle::value /* style */) {
  void *pNode = m_builder.NewSequence(mark, tag, GetCurrentParent());
  m_containers.push(ContainerFrame(pNode));
  RegisterAnchor(anchor, pNode);
}